

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unbuf.cc
# Opt level: O0

ssize_t __thiscall bsplib::Unbuf::send(Unbuf *this,int __fd,void *__buf,size_t __n,int __flags)

{
  int iVar1;
  size_type sVar2;
  exception *this_00;
  exception *e;
  undefined1 local_200 [8];
  Entry entry;
  exception local_1d0;
  ulong local_30;
  size_t int_max;
  size_t size_local;
  void *addr_local;
  Unbuf *pUStack_10;
  int dst_pid_local;
  Unbuf *this_local;
  
  int_max = __n;
  size_local = (size_t)__buf;
  addr_local._4_4_ = __fd;
  pUStack_10 = this;
  iVar1 = std::numeric_limits<int>::max();
  local_30 = (ulong)iVar1;
  sVar2 = std::vector<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>::size
                    (&this->m_sends);
  if (((local_30 >> 1) - (long)this->m_pid) / (ulong)(long)this->m_nprocs < sVar2) {
    entry.tag._3_1_ = 1;
    this_00 = (exception *)__cxa_allocate_exception(0x1a0);
    exception::exception(&local_1d0,"bsp_hpput");
    e = exception::operator<<(&local_1d0,(char (*) [21])"Too many HP messages");
    exception::exception(this_00,e);
    entry.tag._3_1_ = 0;
    __cxa_throw(this_00,&exception::typeinfo,exception::~exception);
  }
  local_200._0_4_ = addr_local._4_4_;
  entry._0_8_ = size_local;
  entry.addr = (char *)int_max;
  sVar2 = std::vector<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>::size
                    (&this->m_sends);
  entry.size._0_4_ = ((int)sVar2 * this->m_nprocs + this->m_pid) * 2;
  std::vector<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>::push_back
            (&this->m_sends,(value_type *)local_200);
  return (ulong)(uint)entry.size;
}

Assistant:

int Unbuf :: send( int dst_pid, const void * addr, size_t size )
{
    size_t int_max = std::numeric_limits<int>::max();
    if ( m_sends.size() > (int_max/2 - m_pid)/m_nprocs )
        throw exception("bsp_hpput") << "Too many HP messages";

    Entry entry = { dst_pid, 
                    static_cast<char *>(const_cast<void*>(addr)),
                    size,
                    (int( m_sends.size() ) * m_nprocs + m_pid)*2
                  };
    m_sends.push_back( entry );
    return entry.tag;
}